

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O0

int lgx_str_init(lgx_str_t *str,uint size)

{
  char *pcVar1;
  uint size_local;
  lgx_str_t *str_local;
  
  memset(str,0,0x10);
  if (size != 0) {
    pcVar1 = (char *)malloc((ulong)size);
    str->buffer = pcVar1;
    if (str->buffer == (char *)0x0) {
      return 1;
    }
    str->size = size;
  }
  return 0;
}

Assistant:

int lgx_str_init(lgx_str_t* str, unsigned size) {
    memset(str, 0, sizeof(lgx_str_t));

    if (size > 0) {
        str->buffer = xmalloc(size);
        if (!str->buffer) {
            return 1;
        }

        str->size = size;
    }

    return 0;
}